

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmAliasDefinition
                    (ExpressionContext *ctx,VmModule *module,ExprAliasDefinition *node)

{
  VmValue *pVVar1;
  
  pVVar1 = anon_unknown.dwarf_20a43d::CreateVoid(module);
  pVVar1 = anon_unknown.dwarf_20a43d::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmAliasDefinition(ExpressionContext &ctx, VmModule *module, ExprAliasDefinition *node)
{
	return CheckType(ctx, node, CreateVoid(module));
}